

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::formatFuncArgs
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,FuncDetail *fd,
                VirtReg **vRegs)

{
  Error EVar1;
  ulong uVar2;
  
  if (fd->_argCount != '\0') {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        EVar1 = StringBuilder::_opString(sb,1,", ",0xffffffffffffffff);
        if (EVar1 != 0) {
          return EVar1;
        }
        if (0x1f < uVar2) {
          formatFuncArgs();
        }
      }
      EVar1 = formatFuncDetailValue(sb,logOptions,emitter,(Value)fd->_args[uVar2]._value);
      if (EVar1 != 0) {
        return EVar1;
      }
      if ((vRegs != (VirtReg **)0x0) &&
         (EVar1 = StringBuilder::appendFormat(sb," {%s}",vRegs[uVar2]->_name), EVar1 != 0)) {
        return EVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < fd->_argCount);
  }
  return 0;
}

Assistant:

static Error formatFuncArgs(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  const FuncDetail& fd,
  VirtReg* const* vRegs) noexcept {

  for (uint32_t i = 0; i < fd.getArgCount(); i++) {
    if (i) ASMJIT_PROPAGATE(sb.appendString(", "));
    ASMJIT_PROPAGATE(formatFuncDetailValue(sb, logOptions, emitter, fd.getArg(i)));

#if !defined(ASMJIT_DISABLE_COMPILER)
    if (vRegs)
      ASMJIT_PROPAGATE(sb.appendFormat(" {%s}", vRegs[i]->getName()));
#endif // !ASMJIT_DISABLE_COMPILER
  }

  return kErrorOk;
}